

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O0

bool google::protobuf::util::FieldMaskUtil::GetFieldDescriptors
               (Descriptor *descriptor,string_view path,
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *field_descriptors)

{
  string_view name;
  bool bVar1;
  CppType CVar2;
  reference pbVar3;
  char in_R8B;
  ConvertibleToStringView text;
  FieldDescriptor *local_b8;
  FieldDescriptor *field;
  size_t sStack_a8;
  string_view field_name;
  iterator __end2;
  iterator __begin2;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range2;
  ConvertibleToStringView local_70;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_60;
  undefined1 local_48 [8];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  parts;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *field_descriptors_local;
  Descriptor *descriptor_local;
  string_view path_local;
  
  parts.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)field_descriptors;
  if (field_descriptors !=
      (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       *)0x0) {
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::clear(field_descriptors);
  }
  absl::lts_20250127::strings_internal::ConvertibleToStringView::ConvertibleToStringView
            (&local_70,path);
  text.value_._M_str = (char *)0x2e;
  text.value_._M_len = (size_t)local_70.value_._M_str;
  absl::lts_20250127::StrSplit<char>(&local_60,(lts_20250127 *)local_70.value_._M_len,text,in_R8B);
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::
  operator_vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_nullptr>
            ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)local_48,&local_60);
  __end2 = std::
           vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)local_48);
  field_name._M_str =
       (char *)std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)local_48);
  field_descriptors_local =
       (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        *)descriptor;
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                *)&field_name._M_str);
    if (!bVar1) {
      path_local._M_str._7_1_ = true;
LAB_01b54abc:
      field._4_4_ = 1;
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)local_48);
      return path_local._M_str._7_1_;
    }
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             ::operator*(&__end2);
    sStack_a8 = pbVar3->_M_len;
    field_name._M_len = (size_t)pbVar3->_M_str;
    name._M_len = pbVar3->_M_len;
    name._M_str = pbVar3->_M_str;
    if (field_descriptors_local ==
        (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         *)0x0) {
      path_local._M_str._7_1_ = false;
      goto LAB_01b54abc;
    }
    local_b8 = Descriptor::FindFieldByName((Descriptor *)field_descriptors_local,name);
    if (local_b8 == (FieldDescriptor *)0x0) {
      path_local._M_str._7_1_ = false;
      goto LAB_01b54abc;
    }
    if (parts.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)parts.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_b8);
    }
    bVar1 = FieldDescriptor::is_repeated(local_b8);
    if (bVar1) {
LAB_01b54a93:
      field_descriptors_local =
           (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)0x0;
    }
    else {
      CVar2 = FieldDescriptor::cpp_type(local_b8);
      if (CVar2 != CPPTYPE_MESSAGE) goto LAB_01b54a93;
      field_descriptors_local =
           (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)FieldDescriptor::message_type(local_b8);
    }
    __gnu_cxx::
    __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool FieldMaskUtil::GetFieldDescriptors(
    const Descriptor* descriptor, absl::string_view path,
    std::vector<const FieldDescriptor*>* field_descriptors) {
  if (field_descriptors != nullptr) {
    field_descriptors->clear();
  }
  std::vector<absl::string_view> parts = absl::StrSplit(path, '.');
  for (absl::string_view field_name : parts) {
    if (descriptor == nullptr) {
      return false;
    }
    const FieldDescriptor* field = descriptor->FindFieldByName(field_name);
    if (field == nullptr) {
      return false;
    }
    if (field_descriptors != nullptr) {
      field_descriptors->push_back(field);
    }
    if (!field->is_repeated() &&
        field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      descriptor = field->message_type();
    } else {
      descriptor = nullptr;
    }
  }
  return true;
}